

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegexpPtr xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlChar *str2;
  xmlRegStatePtr pxVar3;
  int iVar4;
  void *pvVar5;
  xmlRegCounter *pxVar6;
  void *pvVar7;
  xmlRegCounter xVar8;
  int *piVar9;
  xmlRegTrans *pxVar10;
  xmlRegTransPtr trans;
  xmlRegStatePtr state;
  int prev;
  int targetno;
  int atomno;
  int stateno;
  xmlChar *value;
  xmlChar **stringMap;
  void **transdata;
  int *transitions;
  int *stringRemap;
  int *stateRemap;
  int nbatoms;
  int nbstates;
  int j;
  int i;
  xmlRegexpPtr ret;
  xmlRegParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x68);
  if (ctxt_local == (xmlRegParserCtxtPtr)0x0) {
    xmlRegexpErrMemory(ctxt);
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x68);
    ctxt_local->string = ctxt->string;
    *(int *)&ctxt_local->cur = ctxt->nbStates;
    *(xmlRegStatePtr **)&ctxt_local->error = ctxt->states;
    *(int *)&ctxt_local->start = ctxt->nbAtoms;
    ctxt_local->end = (xmlRegStatePtr)ctxt->atoms;
    *(int *)&ctxt_local->state = ctxt->nbCounters;
    ctxt_local->atom = (xmlRegAtomPtr)ctxt->counters;
    ctxt_local->maxAtoms = ctxt->determinist;
    ctxt_local->nbAtoms = ctxt->flags;
    if ((ctxt_local->maxAtoms == -1) &&
       (iVar4 = xmlRegexpIsDeterminist((xmlRegexpPtr)ctxt_local), iVar4 < 0)) {
      xmlRegexpErrMemory(ctxt);
      (*xmlFree)(ctxt_local);
      ctxt_local = (xmlRegParserCtxtPtr)0x0;
    }
    else {
      if ((ctxt_local->maxAtoms != 0) &&
         ((((*(int *)&ctxt_local->state == 0 && (ctxt->negs == 0)) &&
           (ctxt_local->end != (xmlRegStatePtr)0x0)) &&
          ((*(xmlRegAtomPtr *)ctxt_local->end != (xmlRegAtomPtr)0x0 &&
           ((*(xmlRegAtomPtr *)ctxt_local->end)->type == XML_REGEXP_STRING)))))) {
        stateRemap._4_4_ = 0;
        stateRemap._0_4_ = 0;
        pvVar5 = (*xmlMalloc)((long)*(int *)&ctxt_local->cur << 2);
        if (pvVar5 == (void *)0x0) {
          xmlRegexpErrMemory(ctxt);
          (*xmlFree)(ctxt_local);
          return (xmlRegexpPtr)0x0;
        }
        for (nbstates = 0; nbstates < *(int *)&ctxt_local->cur; nbstates = nbstates + 1) {
          if ((*(xmlRegStatePtr **)&ctxt_local->error)[nbstates] == (xmlRegStatePtr)0x0) {
            *(undefined4 *)((long)pvVar5 + (long)nbstates * 4) = 0xffffffff;
          }
          else {
            *(int *)((long)pvVar5 + (long)nbstates * 4) = stateRemap._4_4_;
            stateRemap._4_4_ = stateRemap._4_4_ + 1;
          }
        }
        pxVar6 = (xmlRegCounter *)(*xmlMalloc)((long)*(int *)&ctxt_local->start << 3);
        if (pxVar6 == (xmlRegCounter *)0x0) {
          xmlRegexpErrMemory(ctxt);
          (*xmlFree)(pvVar5);
          (*xmlFree)(ctxt_local);
          return (xmlRegexpPtr)0x0;
        }
        pvVar7 = (*xmlMalloc)((long)*(int *)&ctxt_local->start << 2);
        if (pvVar7 == (void *)0x0) {
          xmlRegexpErrMemory(ctxt);
          (*xmlFree)(pxVar6);
          (*xmlFree)(pvVar5);
          (*xmlFree)(ctxt_local);
          return (xmlRegexpPtr)0x0;
        }
        for (nbstates = 0; nbstates < *(int *)&ctxt_local->start; nbstates = nbstates + 1) {
          if ((*(int *)(*(long *)(&ctxt_local->end->type + (long)nbstates * 2) + 4) != 5) ||
             (*(int *)(*(long *)(&ctxt_local->end->type + (long)nbstates * 2) + 8) != 2)) {
            (*xmlFree)(pvVar5);
            (*xmlFree)(pvVar7);
            for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
              (*xmlFree)((void *)pxVar6[nbstates]);
            }
            (*xmlFree)(pxVar6);
            (*xmlFree)(ctxt_local);
            return (xmlRegexpPtr)0x0;
          }
          str2 = *(xmlChar **)(*(long *)(&ctxt_local->end->type + (long)nbstates * 2) + 0x18);
          for (nbatoms = 0; nbatoms < (int)stateRemap; nbatoms = nbatoms + 1) {
            iVar4 = xmlStrEqual((xmlChar *)pxVar6[nbatoms],str2);
            if (iVar4 != 0) {
              *(int *)((long)pvVar7 + (long)nbstates * 4) = nbatoms;
              break;
            }
          }
          if ((int)stateRemap <= nbatoms) {
            *(int *)((long)pvVar7 + (long)nbstates * 4) = (int)stateRemap;
            xVar8 = (xmlRegCounter)xmlStrdup(str2);
            pxVar6[(int)stateRemap] = xVar8;
            if (pxVar6[(int)stateRemap] == (xmlRegCounter)0x0) {
              for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
                (*xmlFree)((void *)pxVar6[nbstates]);
              }
              (*xmlFree)(pvVar7);
              (*xmlFree)(pxVar6);
              (*xmlFree)(pvVar5);
              (*xmlFree)(ctxt_local);
              return (xmlRegexpPtr)0x0;
            }
            stateRemap._0_4_ = (int)stateRemap + 1;
          }
        }
        piVar9 = (int *)xmlRegCalloc2((long)(stateRemap._4_4_ + 1),(long)((int)stateRemap + 1),4);
        if (piVar9 == (int *)0x0) {
          (*xmlFree)(pvVar5);
          (*xmlFree)(pvVar7);
          for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
            (*xmlFree)((void *)pxVar6[nbstates]);
          }
          (*xmlFree)(pxVar6);
          (*xmlFree)(ctxt_local);
          return (xmlRegexpPtr)0x0;
        }
        stringMap = (xmlChar **)0x0;
        for (nbstates = 0; nbstates < *(int *)&ctxt_local->cur; nbstates = nbstates + 1) {
          iVar4 = *(int *)((long)pvVar5 + (long)nbstates * 4);
          if (iVar4 != -1) {
            pxVar3 = (*(xmlRegStatePtr **)&ctxt_local->error)[nbstates];
            piVar9[iVar4 * ((int)stateRemap + 1)] = pxVar3->type;
            nbatoms = 0;
LAB_001b59be:
            if (nbatoms < pxVar3->nbTrans) {
              pxVar10 = pxVar3->trans + nbatoms;
              if ((pxVar10->to < 0) || (pxVar10->atom == (xmlRegAtomPtr)0x0)) goto LAB_001b5b88;
              iVar1 = *(int *)((long)pvVar7 + (long)pxVar10->atom->no * 4);
              if ((pxVar10->atom->data == (void *)0x0) ||
                 ((stringMap != (xmlChar **)0x0 ||
                  (stringMap = (xmlChar **)
                               xmlRegCalloc2((long)stateRemap._4_4_,(long)(int)stateRemap,8),
                  stringMap != (xmlChar **)0x0)))) {
                iVar2 = *(int *)((long)pvVar5 + (long)pxVar10->to * 4);
                if (piVar9[iVar4 * ((int)stateRemap + 1) + iVar1 + 1] == 0) {
                  piVar9[iVar4 * ((int)stateRemap + 1) + iVar1 + 1] = iVar2 + 1;
                  if (stringMap != (xmlChar **)0x0) {
                    stringMap[iVar4 * (int)stateRemap + iVar1] = (xmlChar *)pxVar10->atom->data;
                  }
                  goto LAB_001b5b88;
                }
                if (piVar9[iVar4 * ((int)stateRemap + 1) + iVar1 + 1] == iVar2 + 1)
                goto LAB_001b5b88;
                ctxt_local->maxAtoms = 0;
                if (stringMap != (xmlChar **)0x0) {
                  (*xmlFree)(stringMap);
                }
                (*xmlFree)(piVar9);
                (*xmlFree)(pvVar5);
                (*xmlFree)(pvVar7);
                for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
                  (*xmlFree)((void *)pxVar6[nbstates]);
                }
                (*xmlFree)(pxVar6);
                goto LAB_001b5cdd;
              }
              xmlRegexpErrMemory(ctxt);
            }
          }
        }
        ctxt_local->maxAtoms = 1;
        if (*(xmlRegStatePtr **)&ctxt_local->error != (xmlRegStatePtr *)0x0) {
          for (nbstates = 0; nbstates < *(int *)&ctxt_local->cur; nbstates = nbstates + 1) {
            xmlRegFreeState((*(xmlRegStatePtr **)&ctxt_local->error)[nbstates]);
          }
          (*xmlFree)(*(xmlRegStatePtr **)&ctxt_local->error);
        }
        *(xmlRegStatePtr **)&ctxt_local->error = (xmlRegStatePtr *)0x0;
        *(int *)&ctxt_local->cur = 0;
        if (ctxt_local->end != (xmlRegStatePtr)0x0) {
          for (nbstates = 0; nbstates < *(int *)&ctxt_local->start; nbstates = nbstates + 1) {
            xmlRegFreeAtom(*(xmlRegAtomPtr *)(&ctxt_local->end->type + (long)nbstates * 2));
          }
          (*xmlFree)(ctxt_local->end);
        }
        ctxt_local->end = (xmlRegStatePtr)0x0;
        *(int *)&ctxt_local->start = 0;
        *(int **)&ctxt_local->maxStates = piVar9;
        ctxt_local->states = (xmlRegStatePtr *)stringMap;
        ctxt_local->counters = pxVar6;
        ctxt_local->maxCounters = (int)stateRemap;
        *(int *)&ctxt_local->atoms = stateRemap._4_4_;
        (*xmlFree)(pvVar5);
        (*xmlFree)(pvVar7);
      }
LAB_001b5cdd:
      ctxt->string = (xmlChar *)0x0;
      ctxt->nbStates = 0;
      ctxt->states = (xmlRegStatePtr *)0x0;
      ctxt->nbAtoms = 0;
      ctxt->atoms = (xmlRegAtomPtr *)0x0;
      ctxt->nbCounters = 0;
      ctxt->counters = (xmlRegCounter *)0x0;
    }
  }
  return (xmlRegexpPtr)ctxt_local;
LAB_001b5b88:
  nbatoms = nbatoms + 1;
  goto LAB_001b59be;
}

Assistant:

static xmlRegexpPtr
xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt) {
    xmlRegexpPtr ret;

    ret = (xmlRegexpPtr) xmlMalloc(sizeof(xmlRegexp));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegexp));
    ret->string = ctxt->string;
    ret->nbStates = ctxt->nbStates;
    ret->states = ctxt->states;
    ret->nbAtoms = ctxt->nbAtoms;
    ret->atoms = ctxt->atoms;
    ret->nbCounters = ctxt->nbCounters;
    ret->counters = ctxt->counters;
    ret->determinist = ctxt->determinist;
    ret->flags = ctxt->flags;
    if (ret->determinist == -1) {
        if (xmlRegexpIsDeterminist(ret) < 0) {
            xmlRegexpErrMemory(ctxt);
            xmlFree(ret);
            return(NULL);
        }
    }

    if ((ret->determinist != 0) &&
	(ret->nbCounters == 0) &&
	(ctxt->negs == 0) &&
	(ret->atoms != NULL) &&
	(ret->atoms[0] != NULL) &&
	(ret->atoms[0]->type == XML_REGEXP_STRING)) {
	int i, j, nbstates = 0, nbatoms = 0;
	int *stateRemap;
	int *stringRemap;
	int *transitions;
	void **transdata;
	xmlChar **stringMap;
        xmlChar *value;

	/*
	 * Switch to a compact representation
	 * 1/ counting the effective number of states left
	 * 2/ counting the unique number of atoms, and check that
	 *    they are all of the string type
	 * 3/ build a table state x atom for the transitions
	 */

	stateRemap = xmlMalloc(ret->nbStates * sizeof(int));
	if (stateRemap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbStates;i++) {
	    if (ret->states[i] != NULL) {
		stateRemap[i] = nbstates;
		nbstates++;
	    } else {
		stateRemap[i] = -1;
	    }
	}
	stringMap = xmlMalloc(ret->nbAtoms * sizeof(char *));
	if (stringMap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	stringRemap = xmlMalloc(ret->nbAtoms * sizeof(int));
	if (stringRemap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(stringMap);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbAtoms;i++) {
	    if ((ret->atoms[i]->type == XML_REGEXP_STRING) &&
		(ret->atoms[i]->quant == XML_REGEXP_QUANT_ONCE)) {
		value = ret->atoms[i]->valuep;
                for (j = 0;j < nbatoms;j++) {
		    if (xmlStrEqual(stringMap[j], value)) {
			stringRemap[i] = j;
			break;
		    }
		}
		if (j >= nbatoms) {
		    stringRemap[i] = nbatoms;
		    stringMap[nbatoms] = xmlStrdup(value);
		    if (stringMap[nbatoms] == NULL) {
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringRemap);
			xmlFree(stringMap);
			xmlFree(stateRemap);
			xmlFree(ret);
			return(NULL);
		    }
		    nbatoms++;
		}
	    } else {
		xmlFree(stateRemap);
		xmlFree(stringRemap);
		for (i = 0;i < nbatoms;i++)
		    xmlFree(stringMap[i]);
		xmlFree(stringMap);
		xmlFree(ret);
		return(NULL);
	    }
	}
	transitions = (int *) xmlRegCalloc2(nbstates + 1, nbatoms + 1,
                                            sizeof(int));
	if (transitions == NULL) {
	    xmlFree(stateRemap);
	    xmlFree(stringRemap);
            for (i = 0;i < nbatoms;i++)
		xmlFree(stringMap[i]);
	    xmlFree(stringMap);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * Allocate the transition table. The first entry for each
	 * state corresponds to the state type.
	 */
	transdata = NULL;

	for (i = 0;i < ret->nbStates;i++) {
	    int stateno, atomno, targetno, prev;
	    xmlRegStatePtr state;
	    xmlRegTransPtr trans;

	    stateno = stateRemap[i];
	    if (stateno == -1)
		continue;
	    state = ret->states[i];

	    transitions[stateno * (nbatoms + 1)] = state->type;

	    for (j = 0;j < state->nbTrans;j++) {
		trans = &(state->trans[j]);
		if ((trans->to < 0) || (trans->atom == NULL))
		    continue;
                atomno = stringRemap[trans->atom->no];
		if ((trans->atom->data != NULL) && (transdata == NULL)) {
		    transdata = (void **) xmlRegCalloc2(nbstates, nbatoms,
			                                sizeof(void *));
		    if (transdata == NULL) {
			xmlRegexpErrMemory(ctxt);
			break;
		    }
		}
		targetno = stateRemap[trans->to];
		/*
		 * if the same atom can generate transitions to 2 different
		 * states then it means the automata is not deterministic and
		 * the compact form can't be used !
		 */
		prev = transitions[stateno * (nbatoms + 1) + atomno + 1];
		if (prev != 0) {
		    if (prev != targetno + 1) {
			ret->determinist = 0;
			if (transdata != NULL)
			    xmlFree(transdata);
			xmlFree(transitions);
			xmlFree(stateRemap);
			xmlFree(stringRemap);
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringMap);
			goto not_determ;
		    }
		} else {
		    transitions[stateno * (nbatoms + 1) + atomno + 1] =
			targetno + 1; /* to avoid 0 */
		    if (transdata != NULL)
			transdata[stateno * nbatoms + atomno] =
			    trans->atom->data;
		}
	    }
	}
	ret->determinist = 1;
	/*
	 * Cleanup of the old data
	 */
	if (ret->states != NULL) {
	    for (i = 0;i < ret->nbStates;i++)
		xmlRegFreeState(ret->states[i]);
	    xmlFree(ret->states);
	}
	ret->states = NULL;
	ret->nbStates = 0;
	if (ret->atoms != NULL) {
	    for (i = 0;i < ret->nbAtoms;i++)
		xmlRegFreeAtom(ret->atoms[i]);
	    xmlFree(ret->atoms);
	}
	ret->atoms = NULL;
	ret->nbAtoms = 0;

	ret->compact = transitions;
	ret->transdata = transdata;
	ret->stringMap = stringMap;
	ret->nbstrings = nbatoms;
	ret->nbstates = nbstates;
	xmlFree(stateRemap);
	xmlFree(stringRemap);
    }
not_determ:
    ctxt->string = NULL;
    ctxt->nbStates = 0;
    ctxt->states = NULL;
    ctxt->nbAtoms = 0;
    ctxt->atoms = NULL;
    ctxt->nbCounters = 0;
    ctxt->counters = NULL;
    return(ret);
}